

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_circle_rec(rf_vec2 center,float radius,rf_rec rec)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Bool _Var3;
  undefined4 in_EAX;
  undefined4 in_ECX;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = rec.width * 0.5;
  fVar9 = rec.height * 0.5;
  fVar6 = ABS(center.x - (float)(int)(rec.x + fVar8));
  fVar7 = ABS(center.y - (float)(int)(rec.y + fVar9));
  iVar4 = -(uint)(radius + fVar8 < fVar6);
  iVar5 = -(uint)(radius + fVar9 < fVar7);
  auVar1._4_4_ = iVar4;
  auVar1._0_4_ = iVar4;
  auVar1._8_4_ = iVar5;
  auVar1._12_4_ = iVar5;
  iVar4 = movmskpd(in_EAX,auVar1);
  if (iVar4 == 0) {
    auVar2._4_4_ = -(uint)(fVar8 < fVar6);
    auVar2._0_4_ = -(uint)(fVar8 < fVar6);
    auVar2._8_4_ = -(uint)(fVar9 < fVar7);
    auVar2._12_4_ = -(uint)(fVar9 < fVar7);
    iVar4 = movmskpd(in_ECX,auVar2);
    _Var3 = true;
    if (iVar4 == 3) {
      return (fVar6 - fVar8) * (fVar6 - fVar8) + (fVar7 - fVar9) * (fVar7 - fVar9) <=
             radius * radius;
    }
  }
  else {
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool rf_check_collision_circle_rec(rf_vec2 center, float radius, rf_rec rec)
{
    int recCenterX = (int) (rec.x + rec.width / 2.0f);
    int recCenterY = (int) (rec.y + rec.height / 2.0f);

    float dx = (float) fabs(center.x - recCenterX);
    float dy = (float) fabs(center.y - recCenterY);

    if (dx > (rec.width / 2.0f + radius))
    { return 0; }
    if (dy > (rec.height / 2.0f + radius))
    { return 0; }

    if (dx <= (rec.width / 2.0f))
    { return 1; }
    if (dy <= (rec.height / 2.0f))
    { return 1; }

    float cornerDistanceSq = (dx - rec.width / 2.0f) * (dx - rec.width / 2.0f) +
                             (dy - rec.height / 2.0f) * (dy - rec.height / 2.0f);

    return (cornerDistanceSq <= (radius * radius));
}